

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1eab::DataDump<double>::Run(DataDump<double> *this,istream *input_stream)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar5;
  double data;
  char buffer [128];
  int iVar4;
  
  iVar3 = this->minimum_index_;
  while( true ) {
    bVar1 = sptk::ReadStream<double>(&data,input_stream);
    if (!bVar1) break;
    bVar2 = sptk::SnPrintf<double>(data,&this->print_format_,0x80,buffer);
    if (!bVar2) break;
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    poVar5 = std::operator<<(poVar5,'\t');
    poVar5 = std::operator<<(poVar5,buffer);
    std::operator<<(poVar5,'\n');
    iVar4 = this->minimum_index_ + -1;
    if (this->maximum_index_ != iVar3) {
      iVar4 = iVar3;
    }
    if (this->maximum_index_ == -1) {
      iVar4 = iVar3;
    }
    iVar3 = iVar4 + 1;
  }
  return !bVar1;
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    T data;
    for (int index(minimum_index_); sptk::ReadStream(&data, input_stream);
         ++index) {
      // Format data.
      if (!sptk::SnPrintf(data, print_format_, sizeof(buffer), buffer)) {
        return false;
      }

      // Dump data. Note that std::endl makes the execution speed slow.
      std::cout << index << '\t' << buffer << '\n';

      // Initialize index.
      if (maximum_index_ != kMagicNumberForEndOfFile &&
          maximum_index_ == index) {
        index = minimum_index_ - 1;
      }
    }
    return true;
  }